

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
 __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
::
internal_lower_bound<S2CellId,gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>const,std::pair<S2CellId_const,S2PointIndex<int>::PointData>const&,std::pair<S2CellId_const,S2PointIndex<int>::PointData>const*>>
          (btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
           *this,S2CellId *key,
          btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
          iter)

{
  bool bVar1;
  uint uVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
  *pbVar3;
  int iVar4;
  undefined8 extraout_RDX;
  const_lookup_key_reference<S2CellId> lookup_key;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
  bVar5;
  btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_&,_const_std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_*>
  bVar6;
  
  iVar4 = iter.position;
  pbVar3 = iter.node;
  if (pbVar3 == (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                 *)0x0) {
    pbVar3 = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              *)0x0;
  }
  else {
    while( true ) {
      uVar2 = btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
              ::linear_search<S2CellId,std::less<S2CellId>>
                        ((btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                          *)pbVar3,key,(less<S2CellId> *)this);
      bVar1 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
              ::leaf(pbVar3);
      bVar5.node = (btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                    *)(ulong)(uVar2 & 0x3fffffff);
      if (bVar1) break;
      pbVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
               ::child(pbVar3,uVar2 & 0x3fffffff);
    }
    bVar5._8_8_ = extraout_RDX;
    bVar5 = internal_last<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>const,std::pair<S2CellId_const,S2PointIndex<int>::PointData>const&,std::pair<S2CellId_const,S2PointIndex<int>::PointData>const*>>
                      ((btree<gtl::internal_btree::map_params<S2CellId,S2PointIndex<int>::PointData,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2PointIndex<int>::PointData>>,256,true>>
                        *)pbVar3,bVar5);
    pbVar3 = bVar5.node;
    iVar4 = bVar5.position;
  }
  bVar6.position = iVar4;
  bVar6.node = pbVar3;
  bVar6._12_4_ = 0;
  return bVar6;
}

Assistant:

IterType btree<P>::internal_lower_bound(
    const K &key, IterType iter) const {
  const_lookup_key_reference<K> lookup_key(key);
  if (iter.node) {
    for (;;) {
      iter.position =
          iter.node->lower_bound(lookup_key, key_comp()) & kMatchMask;
      if (iter.node->leaf()) {
        break;
      }
      iter.node = iter.node->child(iter.position);
    }
    iter = internal_last(iter);
  }
  return iter;
}